

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::FuncArgsAssignment::updateFuncFrame(FuncArgsAssignment *this,FuncFrame *frame)

{
  Error EVar1;
  Error EVar2;
  long in_RSI;
  long *in_RDI;
  Error _err_4;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  FuncArgsContext ctx;
  Error _err;
  RAConstraints constraints;
  FuncDetail *func;
  Arch arch;
  uint in_stack_fffffffffffffa78;
  FuncArgsContext *in_stack_fffffffffffffa90;
  FuncArgsContext *in_stack_fffffffffffffa98;
  FuncFrame *in_stack_fffffffffffffaa0;
  FuncArgsContext *in_stack_fffffffffffffaa8;
  RAConstraints *in_stack_fffffffffffffbc0;
  FuncArgsAssignment *in_stack_fffffffffffffbc8;
  FuncFrame *in_stack_fffffffffffffbd0;
  FuncArgsContext *in_stack_fffffffffffffbd8;
  RAConstraints local_48;
  long local_38;
  byte local_29;
  Error local_14;
  
  local_29 = *(byte *)(in_RSI + 4);
  local_38 = *in_RDI;
  if (local_38 == 0) {
    local_14 = DebugUtils::errored(3);
  }
  else {
    RAConstraints::RAConstraints((RAConstraints *)0x13f38f);
    local_14 = RAConstraints::init(&local_48,(EVP_PKEY_CTX *)(ulong)local_29);
    if (local_14 == 0) {
      FuncArgsContext::FuncArgsContext(in_stack_fffffffffffffa90);
      EVar1 = FuncArgsContext::initWorkData
                        (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                         in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
      local_14 = EVar1;
      if ((((EVar1 == 0) &&
           (EVar2 = FuncArgsContext::markDstRegsDirty
                              (in_stack_fffffffffffffa98,(FuncFrame *)in_stack_fffffffffffffa90),
           local_14 = EVar2, EVar2 == 0)) &&
          (local_14 = FuncArgsContext::markScratchRegs
                                (in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0), local_14 == 0
          )) && (local_14 = FuncArgsContext::markStackArgsReg
                                      ((FuncArgsContext *)CONCAT44(EVar1,EVar2),
                                       (FuncFrame *)(ulong)in_stack_fffffffffffffa78), local_14 == 0
                )) {
        local_14 = 0;
      }
    }
  }
  return local_14;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncArgsAssignment::updateFuncFrame(FuncFrame& frame) const noexcept {
  Arch arch = frame.arch();
  const FuncDetail* func = funcDetail();

  if (!func)
    return DebugUtils::errored(kErrorInvalidState);

  RAConstraints constraints;
  ASMJIT_PROPAGATE(constraints.init(arch));

  FuncArgsContext ctx;
  ASMJIT_PROPAGATE(ctx.initWorkData(frame, *this, &constraints));
  ASMJIT_PROPAGATE(ctx.markDstRegsDirty(frame));
  ASMJIT_PROPAGATE(ctx.markScratchRegs(frame));
  ASMJIT_PROPAGATE(ctx.markStackArgsReg(frame));
  return kErrorOk;
}